

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::Resize(Mat *this,int newn)

{
  double *pdVar1;
  ulong uVar2;
  Mat ytemp;
  Mat local_20;
  
  Mat(&local_20,this);
  if (this->n_rows_ * this->n_cols_ != newn) {
    if (this->v_ != (double *)0x0) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = newn;
    this->n_cols_ = 1;
    if (newn < 1) {
      pdVar1 = (double *)0x0;
    }
    else {
      pdVar1 = (double *)operator_new__((ulong)(uint)newn << 3);
    }
    this->v_ = pdVar1;
    if (local_20.n_rows_ < newn) {
      newn = local_20.n_rows_;
    }
    if (0 < newn) {
      uVar2 = 0;
      do {
        pdVar1[uVar2] = local_20.v_[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)newn != uVar2);
    }
  }
  if (local_20.v_ != (double *)0x0) {
    operator_delete__(local_20.v_);
    return;
  }
  return;
}

Assistant:

void Mat::Resize(int newn)
{
	Mat ytemp = (*this);
	if (newn != n_cols_*n_rows_) {
		if (v_ != NULL)
			delete[] (v_);	
		n_rows_ = newn;
		n_cols_ = 1;
		v_ = n_rows_*n_cols_ > 0 ? new double[n_rows_] : NULL;		
		for ( int i = 0; i < min(n_rows_,ytemp.n_rows_); i++)
			v_[i] = ytemp.v_[i];
	}
}